

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorK<4>_>,_false>
::intersect(BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorK<4>_>,_false>
            *this,vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t sVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  Intersectors *pIVar8;
  undefined4 uVar9;
  NodeRef *pNVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  Intersectors *pIVar15;
  ulong uVar16;
  Intersectors *pIVar17;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar18;
  bool bVar19;
  float fVar20;
  float fVar27;
  float fVar28;
  vint4 bi;
  undefined1 auVar21 [16];
  float fVar29;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar31;
  float fVar32;
  float fVar37;
  float fVar38;
  vint4 bi_1;
  float fVar39;
  undefined1 auVar33 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar40;
  float fVar42;
  float fVar43;
  vint4 ai;
  float fVar44;
  undefined1 auVar41 [16];
  float fVar45;
  float fVar48;
  float fVar49;
  vint4 ai_1;
  undefined1 auVar46 [16];
  float fVar50;
  undefined1 auVar47 [16];
  float fVar51;
  float fVar54;
  float fVar55;
  vint4 ai_3;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar56;
  float fVar57;
  uint uVar58;
  float fVar59;
  uint uVar60;
  uint uVar61;
  float fVar62;
  uint uVar63;
  uint uVar64;
  vint4 bi_2;
  float fVar65;
  uint uVar66;
  uint uVar67;
  float fVar68;
  float fVar71;
  float fVar72;
  float fVar73;
  vint4 bi_3;
  float fVar74;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar75;
  uint uVar76;
  float fVar77;
  uint uVar78;
  uint uVar79;
  vint4 ai_2;
  float fVar80;
  uint uVar81;
  undefined1 auVar82 [16];
  float fVar83;
  float fVar86;
  float fVar87;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar88;
  float fVar89;
  float fVar91;
  float fVar92;
  undefined1 auVar90 [16];
  float fVar93;
  float fVar94;
  float fVar96;
  float fVar97;
  undefined1 in_XMM12 [16];
  undefined1 auVar95 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 in_XMM13 [16];
  float fVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  Precalculations pre;
  vint4 bi_8;
  vbool<4> valid_leaf;
  undefined1 local_1758 [16];
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16e8;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  Intersectors *pIVar7;
  
  stack_node[1].ptr = *(undefined8 *)((valid_i->field_0).v[0] + 0x70);
  if ((Intersectors *)stack_node[1].ptr != (Intersectors *)0x8) {
    if ((*(long *)(ray + 8) != 0) && ((*(byte *)(*(long *)(ray + 0x10) + 2) & 1) != 0)) {
      intersectCoherent((vint<4> *)this,(Intersectors *)valid_i,(RayHitK<4> *)This,
                        (RayQueryContext *)ray);
      return;
    }
    auVar53._8_4_ = 0xffffffff;
    auVar53._0_8_ = 0xffffffffffffffff;
    auVar53._12_4_ = 0xffffffff;
    auVar46._0_4_ = -(uint)(*(int *)this == -1);
    auVar46._4_4_ = -(uint)(*(int *)(this + 4) == -1);
    auVar46._8_4_ = -(uint)(*(int *)(this + 8) == -1);
    auVar46._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
    iVar11 = movmskps((int)valid_i,auVar46);
    uVar12 = CONCAT44((int)((ulong)valid_i >> 0x20),iVar11);
    if (iVar11 != 0) {
      auVar25._0_8_ = (This->intersector4).intersect;
      auVar25._8_8_ = (This->intersector4).occluded;
      fVar71 = (float)((ulong)auVar25._0_8_ >> 0x20);
      fVar74 = (float)((ulong)auVar25._8_8_ >> 0x20);
      fVar57 = (float)DAT_01f4bd50;
      fVar59 = DAT_01f4bd50._4_4_;
      fVar62 = DAT_01f4bd50._8_4_;
      fVar65 = DAT_01f4bd50._12_4_;
      auVar82._4_4_ = -(uint)(ABS(fVar71) < fVar59);
      auVar82._0_4_ = -(uint)(ABS((float)auVar25._0_8_) < fVar57);
      auVar82._8_4_ = -(uint)(ABS((float)auVar25._8_8_) < fVar62);
      auVar82._12_4_ = -(uint)(ABS(fVar74) < fVar65);
      auVar82 = blendvps(auVar25,_DAT_01f4bd50,auVar82);
      auVar2 = *(undefined1 (*) [16])&(This->intersector4).name;
      auVar90._4_4_ = -(uint)(ABS(auVar2._4_4_) < fVar59);
      auVar90._0_4_ = -(uint)(ABS(auVar2._0_4_) < fVar57);
      auVar90._8_4_ = -(uint)(ABS(auVar2._8_4_) < fVar62);
      auVar90._12_4_ = -(uint)(ABS(auVar2._12_4_) < fVar65);
      auVar84 = blendvps(auVar2,_DAT_01f4bd50,auVar90);
      auVar3._0_8_ = (This->intersector4_filter).occluded;
      auVar3._8_8_ = (This->intersector4_filter).name;
      fVar77 = (float)((ulong)auVar3._0_8_ >> 0x20);
      fVar80 = (float)((ulong)auVar3._8_8_ >> 0x20);
      auVar95._4_4_ = -(uint)(ABS(fVar77) < fVar59);
      auVar95._0_4_ = -(uint)(ABS((float)auVar3._0_8_) < fVar57);
      auVar95._8_4_ = -(uint)(ABS((float)auVar3._8_8_) < fVar62);
      auVar95._12_4_ = -(uint)(ABS(fVar80) < fVar65);
      auVar90 = blendvps(auVar3,_DAT_01f4bd50,auVar95);
      auVar95 = rcpps(in_XMM12,auVar82);
      local_16f8 = auVar95._0_4_;
      fStack_16f4 = auVar95._4_4_;
      fStack_16f0 = auVar95._8_4_;
      fStack_16ec = auVar95._12_4_;
      auVar95 = rcpps(in_XMM13,auVar84);
      local_1708 = auVar95._0_4_;
      auVar85._0_4_ = auVar84._0_4_ * local_1708;
      fStack_1704 = auVar95._4_4_;
      auVar85._4_4_ = auVar84._4_4_ * fStack_1704;
      fStack_1700 = auVar95._8_4_;
      auVar85._8_4_ = auVar84._8_4_ * fStack_1700;
      fStack_16fc = auVar95._12_4_;
      auVar85._12_4_ = auVar84._12_4_ * fStack_16fc;
      auVar84 = rcpps(auVar85,auVar90);
      local_1718 = auVar84._0_4_;
      fStack_1714 = auVar84._4_4_;
      fStack_1710 = auVar84._8_4_;
      fStack_170c = auVar84._12_4_;
      auVar69._0_8_ =
           CONCAT44(-(uint)(fVar71 < 0.0),-(uint)((float)auVar25._0_8_ < 0.0)) & 0x100000001;
      auVar69._8_4_ = -(uint)((float)auVar25._8_8_ < 0.0) & 1;
      auVar69._12_4_ = -(uint)(fVar74 < 0.0) & 1;
      auVar52._0_8_ =
           CONCAT44(-(uint)(auVar2._4_4_ < 0.0),-(uint)(auVar2._0_4_ < 0.0)) & 0x200000002;
      auVar52._8_4_ = -(uint)(auVar2._8_4_ < 0.0) & 2;
      auVar52._12_4_ = -(uint)(auVar2._12_4_ < 0.0) & 2;
      fStack_1724 = *(float *)((long)&This->ptr + 4);
      fStack_171c = *(float *)((long)&This->leafIntersector + 4);
      local_1738 = *(float *)&(This->collider).collide;
      fStack_1734 = *(float *)((long)&(This->collider).collide + 4);
      fStack_1730 = *(float *)&(This->collider).name;
      fStack_172c = *(float *)((long)&(This->collider).name + 4);
      local_1748 = *(float *)&(This->intersector1).intersect;
      fStack_1744 = *(float *)((long)&(This->intersector1).intersect + 4);
      fStack_1740 = *(float *)&(This->intersector1).occluded;
      fStack_173c = *(float *)((long)&(This->intersector1).occluded + 4);
      auVar84._8_4_ = -(uint)((float)auVar3._8_8_ < 0.0) & 4;
      auVar84._0_8_ =
           CONCAT44(-(uint)(fVar77 < 0.0),-(uint)((float)auVar3._0_8_ < 0.0)) & 0x400000004;
      auVar84._12_4_ = -(uint)(fVar80 < 0.0) & 4;
      auVar2._0_8_ = (This->intersector1).pointQuery;
      auVar2._8_8_ = (This->intersector1).name;
      local_1758 = auVar46 ^ auVar53 | auVar84 | auVar52 | auVar69;
      do {
        lVar13 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        iVar11 = *(int *)(local_1758 + lVar13 * 4);
        auVar70._0_4_ = -(uint)(iVar11 == local_1758._0_4_);
        auVar70._4_4_ = -(uint)(iVar11 == local_1758._4_4_);
        auVar70._8_4_ = -(uint)(iVar11 == local_1758._8_4_);
        auVar70._12_4_ = -(uint)(iVar11 == local_1758._12_4_);
        uVar9 = movmskps((int)lVar13,auVar70);
        uVar12 = uVar12 & ~CONCAT44((int)((ulong)lVar13 >> 0x20),uVar9);
      } while (uVar12 != 0);
      local_1758._8_4_ = 0xffffffff;
      local_1758._0_8_ = 0xffffffffffffffff;
      local_1758._12_4_ = 0xffffffff;
      auVar30._0_4_ = -(uint)(*(int *)this == -1);
      auVar30._4_4_ = -(uint)(*(int *)(this + 4) == -1);
      auVar30._8_4_ = -(uint)(*(int *)(this + 8) == -1);
      auVar30._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
      local_16f8 = local_16f8 + (1.0 - auVar82._0_4_ * local_16f8) * local_16f8;
      fStack_16f4 = fStack_16f4 + (1.0 - auVar82._4_4_ * fStack_16f4) * fStack_16f4;
      fStack_16f0 = fStack_16f0 + (1.0 - auVar82._8_4_ * fStack_16f0) * fStack_16f0;
      fStack_16ec = fStack_16ec + (1.0 - auVar82._12_4_ * fStack_16ec) * fStack_16ec;
      local_1708 = local_1708 + (1.0 - auVar85._0_4_) * local_1708;
      fStack_1704 = fStack_1704 + (1.0 - auVar85._4_4_) * fStack_1704;
      fStack_1700 = fStack_1700 + (1.0 - auVar85._8_4_) * fStack_1700;
      fStack_16fc = fStack_16fc + (1.0 - auVar85._12_4_) * fStack_16fc;
      local_1718 = local_1718 + (1.0 - auVar90._0_4_ * local_1718) * local_1718;
      fStack_1714 = fStack_1714 + (1.0 - auVar90._4_4_ * fStack_1714) * fStack_1714;
      fStack_1710 = fStack_1710 + (1.0 - auVar90._8_4_ * fStack_1710) * fStack_1710;
      fStack_170c = fStack_170c + (1.0 - auVar90._12_4_ * fStack_170c) * fStack_170c;
      auVar46 = maxps(auVar2,ZEXT816(0));
      auVar53 = maxps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,ZEXT816(0));
      iVar11 = (int)DAT_01f45a30;
      iVar103 = DAT_01f45a30._4_4_;
      iVar104 = DAT_01f45a30._8_4_;
      iVar105 = DAT_01f45a30._12_4_;
      local_16e8.v = (__m128)blendvps(_DAT_01f45a30,auVar46,auVar30);
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     blendvps(_DAT_01f45a40,auVar53,auVar30);
      pNVar10 = stack_node + 2;
      paVar18 = &stack_near[2].field_0;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_near[1].field_0 = local_16e8;
      local_1728 = *(float *)&This->ptr;
      fStack_1720 = *(float *)&This->leafIntersector;
      pIVar7 = (Intersectors *)stack_node[1].ptr;
      fVar57 = local_1748;
      fVar59 = fStack_1744;
      fVar62 = fStack_1740;
      fVar65 = fStack_173c;
      fVar71 = local_1738;
      fVar74 = fStack_1734;
      fVar77 = fStack_1730;
      fVar80 = fStack_172c;
      fVar83 = local_1718;
      fVar86 = fStack_1714;
      fVar87 = fStack_1710;
      fVar88 = fStack_170c;
      fVar89 = *(float *)&This->ptr;
      fVar91 = fStack_1724;
      fVar92 = *(float *)&This->leafIntersector;
      fVar93 = fStack_171c;
      fVar94 = local_16f8;
      fVar96 = fStack_16f4;
      fVar97 = fStack_16f0;
      fVar98 = fStack_16ec;
      fVar99 = local_1708;
      fVar100 = fStack_1704;
      fVar101 = fStack_1700;
      fVar102 = fStack_16fc;
LAB_006dc1a9:
      pNVar1 = pNVar10 + -1;
      if ((Intersectors *)pNVar1->ptr != (Intersectors *)&DAT_fffffffffffffff8) {
        pNVar10 = pNVar10 + -1;
        aVar31 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18[-1].v;
        paVar18 = paVar18 + -1;
        auVar21._4_4_ = -(uint)(aVar31.v[1] < (float)bi_8.field_0.i[1]);
        auVar21._0_4_ = -(uint)(aVar31.v[0] < (float)bi_8.field_0.i[0]);
        auVar21._8_4_ = -(uint)(aVar31.v[2] < (float)bi_8.field_0.i[2]);
        auVar21._12_4_ = -(uint)(aVar31._12_4_ < (float)bi_8.field_0.i[3]);
        uVar6 = movmskps((int)pIVar7,auVar21);
        pIVar7 = (Intersectors *)(ulong)uVar6;
        pIVar17 = (Intersectors *)pNVar1->ptr;
        if (uVar6 != 0) {
          while (((ulong)pIVar17 & 8) == 0) {
            uVar12 = (ulong)pIVar17 & 0xfffffffffffffff0;
            aVar31.i[1] = iVar103;
            aVar31.i[0] = iVar11;
            aVar31.i[2] = iVar104;
            aVar31.i[3] = iVar105;
            uVar16 = 0;
            pIVar7 = (Intersectors *)0x8;
            for (lVar13 = 0;
                (lVar13 != 4 &&
                (pIVar15 = *(Intersectors **)(uVar12 + lVar13 * 8), pIVar15 != (Intersectors *)0x8))
                ; lVar13 = lVar13 + 1) {
              fVar75 = *(float *)((long)&(pIVar17->intersector1).intersect + lVar13 * 4);
              fVar29 = *(float *)((long)&(pIVar17->intersector1).pointQuery + lVar13 * 4);
              fVar20 = *(float *)((long)&(pIVar17->intersector4).intersect + lVar13 * 4);
              fVar39 = *(float *)((long)&(pIVar17->intersector4).name + lVar13 * 4);
              fVar40 = (fVar75 - fVar89) * fVar94;
              fVar42 = (fVar75 - fVar91) * fVar96;
              fVar43 = (fVar75 - fVar92) * fVar97;
              fVar44 = (fVar75 - fVar93) * fVar98;
              fVar45 = (fVar20 - fVar71) * fVar99;
              fVar48 = (fVar20 - fVar74) * fVar100;
              fVar49 = (fVar20 - fVar77) * fVar101;
              fVar50 = (fVar20 - fVar80) * fVar102;
              fVar75 = *(float *)((long)&(pIVar17->intersector4_filter).occluded + lVar13 * 4);
              fVar51 = (fVar75 - fVar57) * fVar83;
              fVar54 = (fVar75 - fVar59) * fVar86;
              fVar55 = (fVar75 - fVar62) * fVar87;
              fVar56 = (fVar75 - fVar65) * fVar88;
              fVar20 = (fVar29 - fVar89) * fVar94;
              fVar27 = (fVar29 - fVar91) * fVar96;
              fVar28 = (fVar29 - fVar92) * fVar97;
              fVar29 = (fVar29 - fVar93) * fVar98;
              fVar32 = (fVar39 - fVar71) * fVar99;
              fVar37 = (fVar39 - fVar74) * fVar100;
              fVar38 = (fVar39 - fVar77) * fVar101;
              fVar39 = (fVar39 - fVar80) * fVar102;
              fVar75 = *(float *)((long)&(pIVar17->intersector4_nofilter).intersect + lVar13 * 4);
              fVar68 = (fVar75 - fVar57) * fVar83;
              fVar72 = (fVar75 - fVar59) * fVar86;
              fVar73 = (fVar75 - fVar62) * fVar87;
              fVar75 = (fVar75 - fVar65) * fVar88;
              uVar6 = (uint)((int)fVar20 < (int)fVar40) * (int)fVar20 |
                      (uint)((int)fVar20 >= (int)fVar40) * (int)fVar40;
              uVar60 = (uint)((int)fVar27 < (int)fVar42) * (int)fVar27 |
                       (uint)((int)fVar27 >= (int)fVar42) * (int)fVar42;
              uVar63 = (uint)((int)fVar28 < (int)fVar43) * (int)fVar28 |
                       (uint)((int)fVar28 >= (int)fVar43) * (int)fVar43;
              uVar66 = (uint)((int)fVar29 < (int)fVar44) * (int)fVar29 |
                       (uint)((int)fVar29 >= (int)fVar44) * (int)fVar44;
              uVar76 = (uint)((int)fVar32 < (int)fVar45) * (int)fVar32 |
                       (uint)((int)fVar32 >= (int)fVar45) * (int)fVar45;
              uVar78 = (uint)((int)fVar37 < (int)fVar48) * (int)fVar37 |
                       (uint)((int)fVar37 >= (int)fVar48) * (int)fVar48;
              uVar79 = (uint)((int)fVar38 < (int)fVar49) * (int)fVar38 |
                       (uint)((int)fVar38 >= (int)fVar49) * (int)fVar49;
              uVar81 = (uint)((int)fVar39 < (int)fVar50) * (int)fVar39 |
                       (uint)((int)fVar39 >= (int)fVar50) * (int)fVar50;
              uVar76 = ((int)uVar76 < (int)uVar6) * uVar6 | ((int)uVar76 >= (int)uVar6) * uVar76;
              uVar78 = ((int)uVar78 < (int)uVar60) * uVar60 | ((int)uVar78 >= (int)uVar60) * uVar78;
              uVar79 = ((int)uVar79 < (int)uVar63) * uVar63 | ((int)uVar79 >= (int)uVar63) * uVar79;
              uVar81 = ((int)uVar81 < (int)uVar66) * uVar66 | ((int)uVar81 >= (int)uVar66) * uVar81;
              uVar6 = (uint)((int)fVar68 < (int)fVar51) * (int)fVar68 |
                      (uint)((int)fVar68 >= (int)fVar51) * (int)fVar51;
              uVar60 = (uint)((int)fVar72 < (int)fVar54) * (int)fVar72 |
                       (uint)((int)fVar72 >= (int)fVar54) * (int)fVar54;
              uVar63 = (uint)((int)fVar73 < (int)fVar55) * (int)fVar73 |
                       (uint)((int)fVar73 >= (int)fVar55) * (int)fVar55;
              uVar66 = (uint)((int)fVar75 < (int)fVar56) * (int)fVar75 |
                       (uint)((int)fVar75 >= (int)fVar56) * (int)fVar56;
              uVar58 = ((int)uVar6 < (int)uVar76) * uVar76 | ((int)uVar6 >= (int)uVar76) * uVar6;
              uVar61 = ((int)uVar60 < (int)uVar78) * uVar78 | ((int)uVar60 >= (int)uVar78) * uVar60;
              uVar64 = ((int)uVar63 < (int)uVar79) * uVar79 | ((int)uVar63 >= (int)uVar79) * uVar63;
              uVar67 = ((int)uVar66 < (int)uVar81) * uVar81 | ((int)uVar66 >= (int)uVar81) * uVar66;
              uVar6 = (uint)((int)fVar20 < (int)fVar40) * (int)fVar40 |
                      (uint)((int)fVar20 >= (int)fVar40) * (int)fVar20;
              uVar60 = (uint)((int)fVar27 < (int)fVar42) * (int)fVar42 |
                       (uint)((int)fVar27 >= (int)fVar42) * (int)fVar27;
              uVar63 = (uint)((int)fVar28 < (int)fVar43) * (int)fVar43 |
                       (uint)((int)fVar28 >= (int)fVar43) * (int)fVar28;
              uVar66 = (uint)((int)fVar29 < (int)fVar44) * (int)fVar44 |
                       (uint)((int)fVar29 >= (int)fVar44) * (int)fVar29;
              uVar76 = (uint)((int)fVar32 < (int)fVar45) * (int)fVar45 |
                       (uint)((int)fVar32 >= (int)fVar45) * (int)fVar32;
              uVar78 = (uint)((int)fVar37 < (int)fVar48) * (int)fVar48 |
                       (uint)((int)fVar37 >= (int)fVar48) * (int)fVar37;
              uVar79 = (uint)((int)fVar38 < (int)fVar49) * (int)fVar49 |
                       (uint)((int)fVar38 >= (int)fVar49) * (int)fVar38;
              uVar81 = (uint)((int)fVar39 < (int)fVar50) * (int)fVar50 |
                       (uint)((int)fVar39 >= (int)fVar50) * (int)fVar39;
              uVar6 = ((int)uVar6 < (int)uVar76) * uVar6 | ((int)uVar6 >= (int)uVar76) * uVar76;
              uVar60 = ((int)uVar60 < (int)uVar78) * uVar60 | ((int)uVar60 >= (int)uVar78) * uVar78;
              uVar63 = ((int)uVar63 < (int)uVar79) * uVar63 | ((int)uVar63 >= (int)uVar79) * uVar79;
              uVar66 = ((int)uVar66 < (int)uVar81) * uVar66 | ((int)uVar66 >= (int)uVar81) * uVar81;
              uVar76 = (uint)((int)fVar68 < (int)fVar51) * (int)fVar51 |
                       (uint)((int)fVar68 >= (int)fVar51) * (int)fVar68;
              uVar78 = (uint)((int)fVar72 < (int)fVar54) * (int)fVar54 |
                       (uint)((int)fVar72 >= (int)fVar54) * (int)fVar72;
              uVar79 = (uint)((int)fVar73 < (int)fVar55) * (int)fVar55 |
                       (uint)((int)fVar73 >= (int)fVar55) * (int)fVar73;
              uVar81 = (uint)((int)fVar75 < (int)fVar56) * (int)fVar56 |
                       (uint)((int)fVar75 >= (int)fVar56) * (int)fVar75;
              uVar76 = (uint)(bi_8.field_0.i[0] < (int)uVar76) * bi_8.field_0.i[0] |
                       (bi_8.field_0.i[0] >= (int)uVar76) * uVar76;
              uVar78 = (uint)(bi_8.field_0.i[1] < (int)uVar78) * bi_8.field_0.i[1] |
                       (bi_8.field_0.i[1] >= (int)uVar78) * uVar78;
              uVar79 = (uint)(bi_8.field_0.i[2] < (int)uVar79) * bi_8.field_0.i[2] |
                       (bi_8.field_0.i[2] >= (int)uVar79) * uVar79;
              uVar81 = (uint)(bi_8.field_0.i[3] < (int)uVar81) * bi_8.field_0.i[3] |
                       (bi_8.field_0.i[3] >= (int)uVar81) * uVar81;
              auVar22._4_4_ =
                   -(uint)((float)((uint)((int)uVar61 < (int)local_16e8._4_4_) * local_16e8._4_4_ |
                                  ((int)uVar61 >= (int)local_16e8._4_4_) * uVar61) <=
                          (float)(((int)uVar60 < (int)uVar78) * uVar60 |
                                 ((int)uVar60 >= (int)uVar78) * uVar78));
              auVar22._0_4_ =
                   -(uint)((float)((uint)((int)uVar58 < (int)local_16e8._0_4_) * local_16e8._0_4_ |
                                  ((int)uVar58 >= (int)local_16e8._0_4_) * uVar58) <=
                          (float)(((int)uVar6 < (int)uVar76) * uVar6 |
                                 ((int)uVar6 >= (int)uVar76) * uVar76));
              auVar22._8_4_ =
                   -(uint)((float)((uint)((int)uVar64 < (int)local_16e8._8_4_) * local_16e8._8_4_ |
                                  ((int)uVar64 >= (int)local_16e8._8_4_) * uVar64) <=
                          (float)(((int)uVar63 < (int)uVar79) * uVar63 |
                                 ((int)uVar63 >= (int)uVar79) * uVar79));
              auVar22._12_4_ =
                   -(uint)((float)((uint)((int)uVar67 < (int)local_16e8._12_4_) * local_16e8._12_4_
                                  | ((int)uVar67 >= (int)local_16e8._12_4_) * uVar67) <=
                          (float)(((int)uVar66 < (int)uVar81) * uVar66 |
                                 ((int)uVar66 >= (int)uVar81) * uVar81));
              uVar6 = movmskps((int)context,auVar22);
              pIVar8 = pIVar7;
              context = (RayQueryContext *)(ulong)uVar6;
              aVar34 = aVar31;
              if (uVar6 != 0) {
                auVar33._4_4_ = iVar103;
                auVar33._0_4_ = iVar11;
                auVar33._8_4_ = iVar104;
                auVar33._12_4_ = iVar105;
                auVar5._4_4_ = uVar61;
                auVar5._0_4_ = uVar58;
                auVar5._8_4_ = uVar64;
                auVar5._12_4_ = uVar67;
                aVar34 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         blendvps(auVar33,auVar5,auVar22);
                auVar23._4_4_ = -(uint)(aVar34.v[1] < aVar31.v[1]);
                auVar23._0_4_ = -(uint)(aVar34.v[0] < aVar31.v[0]);
                auVar23._8_4_ = -(uint)(aVar34.v[2] < aVar31.v[2]);
                auVar23._12_4_ = -(uint)(aVar34.v[3] < aVar31.v[3]);
                iVar14 = movmskps(uVar6,auVar23);
                aVar24 = aVar34;
                if ((iVar14 == 0) ||
                   (pIVar8 = pIVar15, pIVar15 = pIVar7, context = (RayQueryContext *)pIVar7,
                   aVar24 = aVar31, aVar31 = aVar34, pIVar7 != (Intersectors *)0x8)) {
                  aVar34 = aVar31;
                  uVar16 = uVar16 + 1;
                  pNVar10->ptr = (size_t)pIVar15;
                  pNVar10 = pNVar10 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18->v = aVar24;
                  paVar18 = paVar18 + 1;
                  context = (RayQueryContext *)pIVar15;
                }
              }
              pIVar7 = pIVar8;
              aVar31 = aVar34;
            }
            if (pIVar7 == (Intersectors *)0x8) goto LAB_006dc1a9;
            pIVar17 = pIVar7;
            if (1 < uVar16) {
              auVar46 = *(undefined1 (*) [16])paVar18[-2].v;
              auVar53 = *(undefined1 (*) [16])paVar18[-1].v;
              auVar35._4_4_ = -(uint)(auVar46._4_4_ < auVar53._4_4_);
              auVar35._0_4_ = -(uint)(auVar46._0_4_ < auVar53._0_4_);
              auVar35._8_4_ = -(uint)(auVar46._8_4_ < auVar53._8_4_);
              auVar35._12_4_ = -(uint)(auVar46._12_4_ < auVar53._12_4_);
              iVar14 = movmskps((int)uVar12,auVar35);
              auVar25 = auVar53;
              if (iVar14 != 0) {
                *(undefined1 (*) [16])paVar18[-2].v = auVar53;
                *(undefined1 (*) [16])paVar18[-1].v = auVar46;
                auVar25 = *(undefined1 (*) [16])(pNVar10 + -2);
                auVar36._0_8_ = auVar25._8_8_;
                auVar36._8_4_ = auVar25._0_4_;
                auVar36._12_4_ = auVar25._4_4_;
                *(undefined1 (*) [16])(pNVar10 + -2) = auVar36;
                auVar25 = auVar46;
                auVar46 = auVar53;
              }
              if (uVar16 != 2) {
                auVar53 = *(undefined1 (*) [16])paVar18[-3].v;
                auVar47._4_4_ = -(uint)(auVar53._4_4_ < auVar25._4_4_);
                auVar47._0_4_ = -(uint)(auVar53._0_4_ < auVar25._0_4_);
                auVar47._8_4_ = -(uint)(auVar53._8_4_ < auVar25._8_4_);
                auVar47._12_4_ = -(uint)(auVar53._12_4_ < auVar25._12_4_);
                uVar6 = movmskps(iVar14,auVar47);
                uVar12 = (ulong)uVar6;
                if (uVar6 != 0) {
                  *(undefined1 (*) [16])paVar18[-3].v = auVar25;
                  *(undefined1 (*) [16])paVar18[-1].v = auVar53;
                  sVar4 = pNVar10[-3].ptr;
                  uVar12 = pNVar10[-1].ptr;
                  pNVar10[-3].ptr = uVar12;
                  pNVar10[-1].ptr = sVar4;
                  auVar53 = auVar25;
                }
                auVar41._4_4_ = -(uint)(auVar53._4_4_ < auVar46._4_4_);
                auVar41._0_4_ = -(uint)(auVar53._0_4_ < auVar46._0_4_);
                auVar41._8_4_ = -(uint)(auVar53._8_4_ < auVar46._8_4_);
                auVar41._12_4_ = -(uint)(auVar53._12_4_ < auVar46._12_4_);
                iVar14 = movmskps((int)uVar12,auVar41);
                if (iVar14 != 0) {
                  *(undefined1 (*) [16])paVar18[-3].v = auVar46;
                  *(undefined1 (*) [16])paVar18[-2].v = auVar53;
                  auVar46 = *(undefined1 (*) [16])(pNVar10 + -3);
                  auVar26._0_8_ = auVar46._8_8_;
                  auVar26._8_4_ = auVar46._0_4_;
                  auVar26._12_4_ = auVar46._4_4_;
                  *(undefined1 (*) [16])(pNVar10 + -3) = auVar26;
                }
              }
            }
          }
          if (pIVar17 == (Intersectors *)&DAT_fffffffffffffff8) {
            return;
          }
          valid_leaf.field_0.i[1] = -(uint)(aVar31.v[1] < (float)bi_8.field_0.i[1]);
          valid_leaf.field_0.i[0] = -(uint)(aVar31.v[0] < (float)bi_8.field_0.i[0]);
          valid_leaf.field_0.i[2] = -(uint)(aVar31.v[2] < (float)bi_8.field_0.i[2]);
          valid_leaf.field_0.i[3] = -(uint)(aVar31.v[3] < (float)bi_8.field_0.i[3]);
          uVar6 = movmskps((int)pIVar7,(undefined1  [16])valid_leaf.field_0);
          pIVar7 = (Intersectors *)(ulong)uVar6;
          if (uVar6 != 0) {
            lVar13 = (ulong)((uint)pIVar17 & 0xf) - 8;
            pIVar17 = (Intersectors *)((ulong)pIVar17 & 0xfffffffffffffff0);
            while (bVar19 = lVar13 != 0, lVar13 = lVar13 + -1, bVar19) {
              context = (RayQueryContext *)pIVar17;
              InstanceArrayIntersectorK<4>::intersect
                        (&valid_leaf,&pre,(RayHitK<4> *)This,(RayQueryContext *)ray,
                         (Primitive_conflict4 *)pIVar17);
              iVar11 = 0x7f800000;
              iVar103 = 0x7f800000;
              iVar104 = 0x7f800000;
              iVar105 = 0x7f800000;
              pIVar17 = (Intersectors *)&pIVar17->leafIntersector;
            }
            bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                           blendvps((undefined1  [16])bi_8.field_0,
                                    *(undefined1 (*) [16])&(This->intersector4_nofilter).name,
                                    (undefined1  [16])valid_leaf.field_0);
            pIVar7 = This;
            fVar57 = local_1748;
            fVar59 = fStack_1744;
            fVar62 = fStack_1740;
            fVar65 = fStack_173c;
            fVar71 = local_1738;
            fVar74 = fStack_1734;
            fVar77 = fStack_1730;
            fVar80 = fStack_172c;
            fVar83 = local_1718;
            fVar86 = fStack_1714;
            fVar87 = fStack_1710;
            fVar88 = fStack_170c;
            fVar89 = local_1728;
            fVar91 = fStack_1724;
            fVar92 = fStack_1720;
            fVar93 = fStack_171c;
            fVar94 = local_16f8;
            fVar96 = fStack_16f4;
            fVar97 = fStack_16f0;
            fVar98 = fStack_16ec;
            fVar99 = local_1708;
            fVar100 = fStack_1704;
            fVar101 = fStack_1700;
            fVar102 = fStack_16fc;
          }
        }
        goto LAB_006dc1a9;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }